

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoop<double,double,duckdb::GreaterThan,true,false,true,true>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  sel_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  double *pdVar13;
  long lVar14;
  
  if (count + 0x3f < 0x40) {
    iVar12 = 0;
  }
  else {
    iVar12 = 0;
    lVar14 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar7 = uVar8;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar10 = count;
        }
LAB_0042ab98:
        if (uVar8 < uVar10) {
          pdVar13 = rdata + uVar8;
          do {
            uVar7 = uVar8;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar7 = (ulong)sel->sel_vector[uVar8];
            }
            bVar5 = GreaterThan::Operation<double>(ldata,pdVar13);
            true_sel->sel_vector[iVar12] = (sel_t)uVar7;
            iVar12 = iVar12 + bVar5;
            false_sel->sel_vector[lVar14] = (sel_t)uVar7;
            lVar14 = lVar14 + (ulong)!bVar5;
            uVar8 = uVar8 + 1;
            pdVar13 = pdVar13 + 1;
            uVar7 = uVar10;
          } while (uVar10 != uVar8);
        }
      }
      else {
        uVar2 = puVar1[uVar9];
        uVar10 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar10 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0042ab98;
        if (uVar2 == 0) {
          uVar7 = uVar10;
          if (uVar8 < uVar10) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              sVar6 = (sel_t)uVar8;
              if (psVar3 != (sel_t *)0x0) {
                sVar6 = psVar3[uVar8];
              }
              psVar4[lVar14] = sVar6;
              lVar14 = lVar14 + 1;
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
        }
        else if (uVar8 < uVar10) {
          pdVar13 = rdata + uVar8;
          uVar11 = 0;
          do {
            if (sel->sel_vector == (sel_t *)0x0) {
              sVar6 = (int)uVar11 + (int)uVar8;
            }
            else {
              sVar6 = sel->sel_vector[uVar8 + uVar11];
            }
            if ((uVar2 >> (uVar11 & 0x3f) & 1) == 0) {
              bVar5 = false;
            }
            else {
              bVar5 = GreaterThan::Operation<double>(ldata,pdVar13);
            }
            true_sel->sel_vector[iVar12] = sVar6;
            iVar12 = iVar12 + bVar5;
            false_sel->sel_vector[lVar14] = sVar6;
            lVar14 = lVar14 + (ulong)(bVar5 ^ 1);
            uVar11 = uVar11 + 1;
            pdVar13 = pdVar13 + 1;
            uVar7 = uVar10;
          } while (uVar10 - uVar8 != uVar11);
        }
      }
      uVar8 = uVar7;
      uVar9 = uVar9 + 1;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return iVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}